

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O3

void write_cell_data(xlsxiowriter handle,char *rowattr,char *prefix,char *suffix,char *format,...)

{
  int iVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  char *__ptr;
  column_info_struct *pcVar4;
  char *pcVar5;
  column_info_struct **ppcVar6;
  uint64_t col;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *data;
  va_list args;
  char *local_118;
  char *local_110;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (handle == (xlsxiowriter)0x0) {
    return;
  }
  local_110 = suffix;
  local_c0 = in_R9;
  if (handle->rowopen == 0) {
    write_row_start(handle,rowattr);
  }
  local_108 = 0x3000000028;
  local_100 = &stack0x00000008;
  local_f8 = local_e8;
  if ((format != (char *)0x0) && (iVar3 = vsnprintf((char *)0x0,0,format,&local_108), -1 < iVar3)) {
    local_118 = (char *)malloc((ulong)(iVar3 + 1));
    if (local_118 != (char *)0x0) {
      local_100 = &stack0x00000008;
      local_108 = 0x3000000028;
      local_f8 = local_e8;
      vsnprintf(local_118,(ulong)(iVar3 + 1),format,&local_108);
      fix_xml_special_chars(&local_118);
      goto LAB_00103276;
    }
  }
  local_118 = (char *)0x0;
  iVar3 = 0;
LAB_00103276:
  col = handle->colnr + 1;
  handle->colnr = col;
  __ptr = get_A1col(col);
  if (handle->sheetopen == 0) {
    if (prefix != (char *)0x0) {
      append_data(&handle->buf,&handle->buflen,prefix,__ptr,handle->rownr);
    }
    if (local_118 != (char *)0x0) {
      append_data(&handle->buf,&handle->buflen,"%s");
    }
    if (local_110 != (char *)0x0) {
      append_data(&handle->buf,&handle->buflen,local_110);
    }
    if (handle->sheetopen == 0) {
      ppcVar6 = handle->pcurrentcolumn;
      if ((*ppcVar6 == (column_info_struct *)0x0) &&
         (pcVar4 = (column_info_struct *)calloc(1,0x10), pcVar4 != (column_info_struct *)0x0)) {
        *ppcVar6 = pcVar4;
      }
      pcVar2 = local_118;
      if (local_118 == (char *)0x0) {
        ppcVar6 = handle->pcurrentcolumn;
      }
      else {
        pcVar5 = strchr(local_118,10);
        iVar1 = (int)pcVar5 - (int)pcVar2;
        if (pcVar5 == (char *)0x0) {
          iVar1 = iVar3;
        }
        ppcVar6 = handle->pcurrentcolumn;
        if ((0 < iVar1) && ((*ppcVar6)->maxwidth < iVar1)) {
          (*ppcVar6)->maxwidth = iVar1;
        }
      }
      handle->pcurrentcolumn = &(*ppcVar6)->next;
    }
  }
  else {
    if (prefix != (char *)0x0) {
      fprintf((FILE *)handle->pipe_write,prefix,__ptr,handle->rownr);
    }
    if (local_118 != (char *)0x0) {
      fputs(local_118,(FILE *)handle->pipe_write);
    }
    if (local_110 != (char *)0x0) {
      fputs(local_110,(FILE *)handle->pipe_write);
    }
  }
  free(__ptr);
  free(local_118);
  return;
}

Assistant:

void write_cell_data (xlsxiowriter handle, const char* rowattr, const char* prefix, const char* suffix, const char* format, ...)
{
  va_list args;
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  char* cellcoord;
#endif
  if (!handle)
    return;
  //start new row if needed
  if (!handle->rowopen)
    write_row_start(handle, rowattr);
  //get formatted data
  int datalen;
  char* data;
  va_start(args, format);
  if (format && (datalen = vsnprintf(NULL, 0, format, args)) >= 0 && (data = (char*)malloc(datalen + 1)) != NULL) {
    va_end(args);
    va_start(args, format);
    vsnprintf(data, datalen + 1, format, args);
    //prepare data for XML output
    fix_xml_special_chars(&data);
  } else {
    data = NULL;
    datalen = 0;
  }
  va_end(args);
  //determine cell coordinate
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  cellcoord = get_A1col(++handle->colnr);
#define COLNRPARAM(handle) , cellcoord, handle->rownr
#else
#define COLNRPARAM(handle)
#endif
  //add cell data
  if (handle->sheetopen) {
    //write cell data
    if (prefix)
      fprintf(handle->pipe_write, prefix COLNRPARAM(handle));
    if (data)
      fprintf(handle->pipe_write, "%s", data);
    if (suffix)
      fprintf(handle->pipe_write, "%s", suffix);
  } else {
    //add cell data to buffer
    if (prefix)
      append_data(&handle->buf, &handle->buflen, prefix COLNRPARAM(handle));
    if (data)
      append_data(&handle->buf, &handle->buflen, "%s", data);
    if (suffix)
      append_data(&handle->buf, &handle->buflen, suffix);
    //collect cell information
    if (!handle->sheetopen) {
      if (!*handle->pcurrentcolumn) {
        //create new column information structure
        struct column_info_struct* colinfo;
        if ((colinfo = (struct column_info_struct*)malloc(sizeof(struct column_info_struct))) != NULL) {
          colinfo->width = 0;
          colinfo->maxwidth = 0;
          colinfo->next = NULL;
          *handle->pcurrentcolumn = colinfo;
        }
      }
      //keep track of biggest column width
      if (data) {
        //only count first line in multiline data
        char* p = strchr(data, '\n');
        if (p)
          datalen = p - data;
        //remember this length if it is the longest one so far
        if (datalen > 0 && datalen > (*handle->pcurrentcolumn)->maxwidth)
          (*handle->pcurrentcolumn)->maxwidth = datalen;
      }
      //prepare for the next column
      handle->pcurrentcolumn = &(*handle->pcurrentcolumn)->next;
    }
  }
#if !defined(NO_ROW_NUMBERS) && !defined(NO_COLUMN_NUMBERS)
  free(cellcoord);
#endif
  free(data);
}